

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O1

natwm_error color_value_from_string(char *string,color_value **result)

{
  natwm_error nVar1;
  color_value *__ptr;
  size_t sVar2;
  ulong uVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar4;
  char *local_30;
  
  uVar4 = 0x1045ed;
  __ptr = (color_value *)malloc(0x10);
  if (__ptr == (color_value *)0x0) {
    nVar1 = MEMORY_ALLOCATION_ERROR;
  }
  else {
    __ptr->string = string;
    __ptr->color_value = 0;
    if (*string == '#') {
      sVar2 = strlen(string);
      if (sVar2 == 7) {
        local_30 = (char *)0x0;
        uVar3 = strtoul(string + 1,&local_30,0x10);
        if (local_30 != (char *)0x0) {
          __ptr->color_value = (uint32_t)uVar3;
          *result = __ptr;
          return NO_ERROR;
        }
        internal_logger(natwm_logger,LEVEL_ERROR,"Found an invalid color value: \'%s\'",string,in_R8
                        ,in_R9,uVar4);
      }
      else {
        internal_logger(natwm_logger,LEVEL_ERROR,"Found a color value with an invalid length");
      }
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Missing \'#\' in color value \'%s\'",string,in_R8,
                      in_R9,uVar4);
    }
    free(__ptr);
    nVar1 = INVALID_INPUT_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error color_value_from_string(const char *string, struct color_value **result)
{
        struct color_value *value = malloc(sizeof(struct color_value));

        if (value == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        value->string = string;
        value->color_value = 0;

        if (string_to_rgb(string, &value->color_value) != NO_ERROR) {
                free(value);

                return INVALID_INPUT_ERROR;
        }

        *result = value;

        return NO_ERROR;
}